

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-math.c
# Opt level: O0

PVG_FT_Long PVG_FT_MulFix(PVG_FT_Long a,PVG_FT_Long b)

{
  undefined8 local_30;
  PVG_FT_Long c;
  long lStack_18;
  PVG_FT_Int s;
  PVG_FT_Long b_local;
  PVG_FT_Long a_local;
  
  c._4_4_ = 1;
  b_local = a;
  if (a < 0) {
    b_local = -a;
    c._4_4_ = -1;
  }
  lStack_18 = b;
  if (b < 0) {
    lStack_18 = -b;
    c._4_4_ = -c._4_4_;
  }
  local_30 = b_local * lStack_18 + 0x8000 >> 0x10;
  if (c._4_4_ < 1) {
    local_30 = -local_30;
  }
  return local_30;
}

Assistant:

PVG_FT_Long PVG_FT_MulFix(PVG_FT_Long a, PVG_FT_Long b)
{
    PVG_FT_Int  s = 1;
    PVG_FT_Long c;

    PVG_FT_MOVE_SIGN(a, s);
    PVG_FT_MOVE_SIGN(b, s);

    c = (PVG_FT_Long)(((PVG_FT_Int64)a * b + 0x8000L) >> 16);

    return (s > 0) ? c : -c;
}